

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tspm.cpp
# Opt level: O3

void __thiscall pg::TSPMSolver::Prog(TSPMSolver *this,int *dst,int *src,int d,int pl)

{
  int *piVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  bool bVar8;
  
  uVar3 = (ulong)(uint)pl;
  uVar2 = (ulong)pl;
  if (src[uVar2] != -1) {
    uVar5 = uVar2;
    if (pl < d) {
      lVar4 = uVar2 << 0x20;
      uVar3 = uVar2;
      do {
        dst[uVar3] = 0;
        lVar4 = lVar4 + 0x200000000;
        uVar3 = uVar3 + 2;
      } while ((long)uVar3 < (long)d);
      uVar5 = lVar4 >> 0x20;
    }
    bVar8 = (int)uVar3 == d;
    lVar4 = this->k;
    if ((long)uVar5 < lVar4) {
      piVar1 = this->counts;
      do {
        iVar6 = (uint)bVar8 + src[uVar5];
        iVar7 = iVar6;
        if (piVar1[uVar5] < iVar6) {
          iVar7 = 0;
        }
        bVar8 = piVar1[uVar5] < iVar6;
        dst[uVar5] = iVar7;
        uVar5 = uVar5 + 2;
      } while ((long)uVar5 < lVar4);
    }
    if (!bVar8) {
      return;
    }
  }
  dst[uVar2] = -1;
  return;
}

Assistant:

void
TSPMSolver::Prog(int *dst, int *src, int d, int pl)
{
    // check if top
    if (src[pl] == -1) {
        dst[pl] = -1;
        return;
    }

    // set every value lower than <d> to 0.
    int i = pl;
    for (; i<d; i+=2) dst[i] = 0;

    int carry = (d == i) ? 1 : 0; // only increase if <d> has parity <pl>

    for (; i<k; i+=2) {
        // increase or copy for same parity
        int v = src[i] + carry;
        if (v > counts[i]) {
            dst[i] = 0;
            carry = 1;
        } else {
            dst[i] = v;
            carry = 0;
        }
    }

    // check if top
    if (carry) dst[pl] = -1;
}